

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
llvm::SmallVectorTemplateCommon<llvm::StringRef,_void>::back
          (SmallVectorTemplateCommon<llvm::StringRef,_void> *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)(this->super_SmallVectorBase).Size;
  if (uVar1 != 0) {
    return (reference)((long)(this->super_SmallVectorBase).BeginX + uVar1 * 0x10 + -0x10);
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0xae,
                "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::back() [T = llvm::StringRef]"
               );
}

Assistant:

LLVM_NODISCARD bool empty() const { return !Size; }